

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3e515::JSONParser::tokenError(JSONParser *this)

{
  byte bVar1;
  lex_state_e lVar2;
  runtime_error *prVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this->done == true) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"JSON: premature end of input");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar2 = this->lex_state;
  switch(lVar2) {
  case ls_alpha:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_38,this->offset);
    std::operator+(&bStack_b8,"JSON: offset ",&local_38);
    std::operator+(&local_98,&bStack_b8,": keyword: unexpected character ");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,this->p,this->p + 1);
    std::operator+(&local_78,&local_98,&local_58);
    std::runtime_error::runtime_error(prVar3,(string *)&local_78);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_string:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&bStack_b8,this->offset);
    std::operator+(&local_98,"JSON: offset ",&bStack_b8);
    std::operator+(&local_78,&local_98,": control character in string (missing \"?)");
    std::runtime_error::runtime_error(prVar3,(string *)&local_78);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_backslash:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_38,this->offset);
    std::operator+(&bStack_b8,"JSON: offset ",&local_38);
    std::operator+(&local_98,&bStack_b8,": invalid character after backslash: ");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,this->p,this->p + 1);
    std::operator+(&local_78,&local_98,&local_58);
    std::runtime_error::runtime_error(prVar3,(string *)&local_78);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_u4:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&bStack_b8,~this->u_count + this->offset);
    std::operator+(&local_98,"JSON: offset ",&bStack_b8);
    std::operator+(&local_78,&local_98,": \\u must be followed by four hex digits");
    std::runtime_error::runtime_error(prVar3,(string *)&local_78);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = *this->p;
  if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
    if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&bStack_b8,this->offset);
      std::operator+(&local_98,"JSON: offset ",&bStack_b8);
      std::operator+(&local_78,&local_98,": numeric literal: unexpected sign");
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&bStack_b8,this->offset);
      std::operator+(&local_98,"JSON: offset ",&bStack_b8);
      std::operator+(&local_78,&local_98,": numeric literal: e already seen");
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bVar1 == 0x2e) {
      if ((lVar2 < ls_alpha) && ((0x182U >> (lVar2 & (ls_begin_dict|ls_end_array)) & 1) != 0)) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&bStack_b8,this->offset);
        std::operator+(&local_98,"JSON: offset ",&bStack_b8);
        std::operator+(&local_78,&local_98,": numeric literal: decimal point after e");
        std::runtime_error::runtime_error(prVar3,(string *)&local_78);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&bStack_b8,this->offset);
      std::operator+(&local_98,"JSON: offset ",&bStack_b8);
      std::operator+(&local_78,&local_98,": numeric literal: decimal point already seen");
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = memchr("{}[]:,",(int)(char)bVar1,7);
    if (pvVar4 == (void *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_38,this->offset);
      std::operator+(&bStack_b8,"JSON: offset ",&local_38);
      std::operator+(&local_98,&bStack_b8,": numeric literal: unexpected character ");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,this->p,this->p + 1);
      std::operator+(&local_78,&local_98,&local_58);
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&bStack_b8,this->offset);
  std::operator+(&local_98,"JSON: offset ",&bStack_b8);
  std::operator+(&local_78,&local_98,": numeric literal: incomplete number");
  std::runtime_error::runtime_error(prVar3,(string *)&local_78);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
JSONParser::tokenError()
{
    if (done) {
        QTC::TC("libtests", "JSON parse ls premature end of input");
        throw std::runtime_error("JSON: premature end of input");
    }

    if (lex_state == ls_u4) {
        QTC::TC("libtests", "JSON parse bad hex after u");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset - u_count - 1) +
            ": \\u must be followed by four hex digits");
    } else if (lex_state == ls_alpha) {
        QTC::TC("libtests", "JSON parse keyword bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": keyword: unexpected character " +
            std::string(p, 1));
    } else if (lex_state == ls_string) {
        QTC::TC("libtests", "JSON parse control char in string");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": control character in string (missing \"?)");
    } else if (lex_state == ls_backslash) {
        QTC::TC("libtests", "JSON parse backslash bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": invalid character after backslash: " + std::string(p, 1));
    }

    if (*p == '.') {
        if (lex_state == ls_number || lex_state == ls_number_e || lex_state == ls_number_e_sign) {
            QTC::TC("libtests", "JSON parse point after e");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point after e");
        } else {
            QTC::TC("libtests", "JSON parse duplicate point");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point already seen");
        }
    } else if (*p == 'e' || *p == 'E') {
        QTC::TC("libtests", "JSON parse duplicate e");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: e already seen");
    } else if ((*p == '+') || (*p == '-')) {
        QTC::TC("libtests", "JSON parse unexpected sign");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected sign");
    } else if (util::is_space(*p) || strchr("{}[]:,", *p)) {
        QTC::TC("libtests", "JSON parse incomplete number");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: incomplete number");

    } else {
        QTC::TC("libtests", "JSON parse numeric bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected character " +
            std::string(p, 1));
    }
    throw std::logic_error("JSON::tokenError : unhandled error");
}